

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1,xmlNodeSetPtr set2)

{
  xmlNodePtr pxVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  
  bVar2 = 0 < set2->nodeNr;
  if (0 < set2->nodeNr) {
    lVar4 = 0;
    do {
      pxVar1 = set2->nodeTab[lVar4];
      if ((set1->nodeMax <= set1->nodeNr) && (iVar3 = xmlXPathNodeSetGrow(set1), iVar3 < 0)) {
        if (bVar2) {
          xmlXPathFreeNodeSet(set1);
          xmlXPathNodeSetClearFromPos(set2,0,1);
          return (xmlNodeSetPtr)0x0;
        }
        break;
      }
      iVar3 = set1->nodeNr;
      set1->nodeNr = iVar3 + 1;
      set1->nodeTab[iVar3] = pxVar1;
      set2->nodeTab[lVar4] = (xmlNodePtr)0x0;
      lVar4 = lVar4 + 1;
      bVar2 = lVar4 < set2->nodeNr;
    } while (lVar4 < set2->nodeNr);
  }
  set2->nodeNr = 0;
  return set1;
}

Assistant:

static xmlNodeSetPtr
xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1, xmlNodeSetPtr set2)
{
    {
	int i;
	xmlNodePtr n2;

	for (i = 0;i < set2->nodeNr;i++) {
	    n2 = set2->nodeTab[i];
            if (set1->nodeNr >= set1->nodeMax) {
                if (xmlXPathNodeSetGrow(set1) < 0)
                    goto error;
            }
	    set1->nodeTab[set1->nodeNr++] = n2;
            set2->nodeTab[i] = NULL;
	}
    }
    set2->nodeNr = 0;
    return(set1);

error:
    xmlXPathFreeNodeSet(set1);
    xmlXPathNodeSetClear(set2, 1);
    return(NULL);
}